

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::GeneratedMessageReflection
          (GeneratedMessageReflection *this,Descriptor *descriptor,Message *default_instance,
          int *offsets,int has_bits_offset,int unknown_fields_offset,int extensions_offset,
          DescriptorPool *descriptor_pool,MessageFactory *factory,int object_size)

{
  DescriptorPool *local_60;
  int unknown_fields_offset_local;
  int has_bits_offset_local;
  int *offsets_local;
  Message *default_instance_local;
  Descriptor *descriptor_local;
  GeneratedMessageReflection *this_local;
  
  Reflection::Reflection(&this->super_Reflection);
  (this->super_Reflection)._vptr_Reflection =
       (_func_int **)&PTR__GeneratedMessageReflection_00411d60;
  this->descriptor_ = descriptor;
  this->default_instance_ = default_instance;
  this->offsets_ = offsets;
  this->has_bits_offset_ = has_bits_offset;
  this->unknown_fields_offset_ = unknown_fields_offset;
  this->extensions_offset_ = extensions_offset;
  this->object_size_ = object_size;
  if (descriptor_pool == (DescriptorPool *)0x0) {
    local_60 = DescriptorPool::generated_pool();
  }
  else {
    local_60 = descriptor_pool;
  }
  this->descriptor_pool_ = local_60;
  this->message_factory_ = factory;
  return;
}

Assistant:

GeneratedMessageReflection::GeneratedMessageReflection(
    const Descriptor* descriptor,
    const Message* default_instance,
    const int offsets[],
    int has_bits_offset,
    int unknown_fields_offset,
    int extensions_offset,
    const DescriptorPool* descriptor_pool,
    MessageFactory* factory,
    int object_size)
  : descriptor_       (descriptor),
    default_instance_ (default_instance),
    offsets_          (offsets),
    has_bits_offset_  (has_bits_offset),
    unknown_fields_offset_(unknown_fields_offset),
    extensions_offset_(extensions_offset),
    object_size_      (object_size),
    descriptor_pool_  ((descriptor_pool == NULL) ?
                         DescriptorPool::generated_pool() :
                         descriptor_pool),
    message_factory_  (factory) {
}